

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::MinerPrivate::handleJobChange(MinerPrivate *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  this->active = true;
  if (this->reset == true) {
    Nonce::reset((this->job).m_index);
  }
  ppIVar1 = (this->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_IBackend[9])(*ppIVar2,&this->job);
  }
  Nonce::touch();
  if (this->enabled != false) {
    LOCK();
    Nonce::m_paused = 0;
    UNLOCK();
  }
  if (this->ticks != 0) {
    return;
  }
  this->ticks = 1;
  Timer::start(this->timer,500,500);
  return;
}

Assistant:

inline void handleJobChange()
    {
        active = true;

        if (reset) {
            Nonce::reset(job.index());
        }

        for (IBackend *backend : backends) {
            backend->setJob(job);
        }

        Nonce::touch();

        if (enabled) {
            Nonce::pause(false);;
        }

        if (ticks == 0) {
            ticks++;
            timer->start(500, 500);
        }
    }